

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O0

ion_status_t oah_delete(ion_hashmap_t *hash_map,ion_key_t key)

{
  ion_status_t iVar1;
  ion_err_t iVar2;
  ion_hash_bucket_t *item;
  ion_key_t pvStack_20;
  int loc;
  ion_key_t key_local;
  ion_hashmap_t *hash_map_local;
  
  item._4_4_ = -1;
  pvStack_20 = key;
  key_local = hash_map;
  iVar2 = oah_find_item_loc(hash_map,key,(int *)((long)&item + 4));
  if (iVar2 != '\x01') {
    *(undefined1 *)
     (*(long *)((long)key_local + 0x30) +
     (long)((*(int *)((long)key_local + 4) + *(int *)((long)key_local + 8) + 1) * item._4_4_)) =
         0xfe;
    hash_map_local._0_4_ = (uint)hash_map_local._1_3_ << 8;
  }
  else {
    hash_map_local._0_4_ = CONCAT31(hash_map_local._1_3_,1);
  }
  iVar1.count._0_1_ = iVar2 != '\x01';
  iVar1._0_4_ = (int)hash_map_local;
  iVar1.count._1_3_ = 0;
  return iVar1;
}

Assistant:

ion_status_t
oah_delete(
	ion_hashmap_t	*hash_map,
	ion_key_t		key
) {
	int loc = -1;

	if (oah_find_item_loc(hash_map, key, &loc) == err_item_not_found) {
#if ION_DEBUG
		printf("Item not found when trying to oah_delete.\n");
#endif
		return ION_STATUS_ERROR(err_item_not_found);
	}
	else {
		/* locate item */
		ion_hash_bucket_t *item = (((ion_hash_bucket_t *) ((hash_map->entry + (hash_map->super.record.key_size + hash_map->super.record.value_size + SIZEOF(STATUS)) * loc))));

		item->status = ION_DELETED;	/* delete item */

#if ION_DEBUG
		printf("Item deleted at location %d\n", loc);
#endif
		return ION_STATUS_OK(1);
	}
}